

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint uVar1;
  Random *this_00;
  TypeBuilder *pTVar2;
  uint32_t uVar3;
  BasicType BVar4;
  int iVar5;
  BasicHeapType BVar6;
  FeatureOptions<wasm::Type::BasicType> *pFVar7;
  ulong uVar8;
  Type TVar9;
  Exactness EVar10;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> eligible;
  uint local_34 [2];
  Index i;
  
  uVar3 = Random::upTo(this->rand,2);
  if (uVar3 == 1) {
    uVar3 = Random::upTo(this->rand,4);
    if (uVar3 == 0) {
      BVar6 = generateBasicHeapType(this,share);
      uVar8 = (ulong)BVar6;
    }
    else if (share == Shared) {
      auStack_68 = (undefined1  [8])0x0;
      eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_34[0] = 0;
      uVar1 = (this->recGroupEnds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[this->index];
      if (uVar1 != 0) {
        do {
          wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
          iVar5 = wasm::HeapType::getShared();
          if (iVar5 == 0) {
            if (eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_68,
                         (iterator)
                         eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_34);
            }
            else {
              *eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = local_34[0];
              eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
          local_34[0] = local_34[0] + 1;
        } while (local_34[0] < uVar1);
      }
      if (auStack_68 ==
          (undefined1  [8])
          eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        BVar6 = generateBasicHeapType(this,Shared);
        uVar8 = (ulong)BVar6;
      }
      else {
        pTVar2 = this->builder;
        Random::pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  (this->rand,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
        uVar8 = wasm::TypeBuilder::getTempHeapType((ulong)pTVar2);
      }
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)eligible.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
    }
    else {
      pTVar2 = this->builder;
      Random::upTo(this->rand,
                   (this->recGroupEnds).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[this->index]);
      uVar8 = wasm::TypeBuilder::getTempHeapType((ulong)pTVar2);
    }
    EVar10 = Exact;
    if (0x7c < uVar8 || ((Nullability)uVar8 & 0x7b) != 0x48) {
      uVar3 = Random::upTo(this->rand,2);
      EVar10 = (Exactness)(uVar3 == 0);
    }
    TVar9.id = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,(Nullability)uVar8,EVar10);
  }
  else {
    if (uVar3 != 0) {
      wasm::handle_unreachable
                ("unexpected",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0xe8);
    }
    this_00 = this->rand;
    eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&eligible;
    eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_68 = (undefined1  [8])0x0;
    eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pFVar7 = Random::FeatureOptions<wasm::Type::BasicType>::
             add<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                       ((FeatureOptions<wasm::Type::BasicType> *)auStack_68,(FeatureSet)0x0,i32,i64,
                        f32,f64);
    pFVar7 = Random::FeatureOptions<wasm::Type::BasicType>::add<>(pFVar7,(FeatureSet)0x8,v128);
    BVar4 = Random::pick<wasm::Type::BasicType>(this_00,pFVar7);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
                 *)auStack_68);
    TVar9.id = (uintptr_t)BVar4;
  }
  return (Type)TVar9.id;
}

Assistant:

Type generateSingleType(Shareability share) {
    switch (rand.upTo(2)) {
      case 0:
        return generateBasicType();
      case 1:
        return generateRefType(share);
    }
    WASM_UNREACHABLE("unexpected");
  }